

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O1

char * PHYSFS_getLastError(void)

{
  ErrState *pEVar1;
  char *pcVar2;
  PHYSFS_ErrorCode code;
  
  pEVar1 = findErrorForCurrentThread();
  if (pEVar1 == (ErrState *)0x0) {
    code = PHYSFS_ERR_OK;
  }
  else {
    code = pEVar1->code;
    pEVar1->code = PHYSFS_ERR_OK;
  }
  if (code == PHYSFS_ERR_OK) {
    return (char *)0x0;
  }
  pcVar2 = PHYSFS_getErrorByCode(code);
  return pcVar2;
}

Assistant:

const char *PHYSFS_getLastError(void)
{
    const PHYSFS_ErrorCode err = PHYSFS_getLastErrorCode();
    return (err) ? PHYSFS_getErrorByCode(err) : NULL;
}